

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

int python2Present(void)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (python2Present::lPython2Present < 0) {
    python2Present::lPython2Present = 0;
    builtin_strncpy(gPython2Name,"python2",8);
    iVar1 = detectPresence(gPython2Name);
    if (iVar1 == 0) {
      uVar3 = 9;
      do {
        iVar2 = (int)uVar3;
        sprintf(gPython2Name,"python2.%d",uVar3);
        iVar1 = detectPresence(gPython2Name);
        if (iVar1 != 0) goto LAB_0011a612;
        uVar3 = (ulong)(iVar2 - 1);
      } while (iVar2 != 0);
    }
    else {
LAB_0011a612:
      python2Present::lPython2Present = 1;
    }
    if ((tinyfd_verbose != 0) &&
       (printf("lPython2Present %d\n",(ulong)(uint)python2Present::lPython2Present),
       tinyfd_verbose != 0)) {
      printf("gPython2Name %s\n",gPython2Name);
    }
  }
  return python2Present::lPython2Present;
}

Assistant:

static int python2Present( )
{
    static int lPython2Present = -1 ;
        int i;

        if ( lPython2Present < 0 )
        {
                lPython2Present = 0 ;
                strcpy(gPython2Name , "python2" ) ;
                if ( detectPresence(gPython2Name) ) lPython2Present = 1;
                else
                {
                        for ( i = 9 ; i >= 0 ; i -- )
                        {
                                sprintf( gPython2Name , "python2.%d" , i ) ;
                                if ( detectPresence(gPython2Name) )
                                {
                                        lPython2Present = 1;
                                        break;
                                }
                        }
                        /*if ( ! lPython2Present )
                        {
                                strcpy(gPython2Name , "python" ) ;
                                if ( detectPresence(gPython2Name) ) lPython2Present = 1;
                        }*/
                }
                if (tinyfd_verbose) printf("lPython2Present %d\n", lPython2Present) ;
                if (tinyfd_verbose) printf("gPython2Name %s\n", gPython2Name) ;
        }
        return lPython2Present ;
}